

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

void GC::CheckClass(char *ptr,ExternTypeInfo *type)

{
  uint uVar1;
  char *__function;
  ulong uVar2;
  long lVar3;
  uint *puVar4;
  
  if ((type->nameHash == objectName) || (type->nameHash == autoArrayName)) {
    if (*(long *)(ptr + 4) != 0) {
      CheckPointer(ptr + 4);
      return;
    }
  }
  else {
    if (type->pointerCount == 0) {
      lVar3 = 0;
    }
    else {
      uVar1 = (type->field_8).arrSize + (type->field_11).subType;
      if (*(uint *)(NULLC::commonLinker + 0x21c) <= uVar1) {
        __function = 
        "T &FastVector<ExternMemberInfo>::operator[](unsigned int) [T = ExternMemberInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
LAB_0024da0e:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,__function);
      }
      lVar3 = (ulong)uVar1 * 0xc + *(long *)(NULLC::commonLinker + 0x210);
    }
    if (type->pointerCount != 0) {
      puVar4 = (uint *)(lVar3 + 8);
      uVar2 = 0;
      do {
        if (*(uint *)(NULLC::commonLinker + 0x20c) <= puVar4[-2]) {
          __function = 
          "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
          ;
          goto LAB_0024da0e;
        }
        CheckVariable(ptr + *puVar4,
                      (ExternTypeInfo *)
                      ((ulong)puVar4[-2] * 0x50 + *(long *)(NULLC::commonLinker + 0x200)));
        uVar2 = uVar2 + 1;
        puVar4 = puVar4 + 3;
      } while (uVar2 < type->pointerCount);
    }
  }
  return;
}

Assistant:

void CheckClass(char* ptr, const ExternTypeInfo& type)
	{
		if(type.nameHash == objectName)
		{
			NULLCRef *data = (NULLCRef*)ptr;

			// Skip uninitialized array
			if(!data->ptr)
				return;

			CheckPointer((char*)&data->ptr);
		}
		else if(type.nameHash == autoArrayName)
		{
			NULLCAutoArray *data = (NULLCAutoArray*)ptr;

			// Skip uninitialized array
			if(!data->ptr)
				return;

			// Check target data
			CheckPointer((char*)&data->ptr);
		}
		else
		{
			const ExternTypeInfo *realType = &type;

			// Get class member type list
			ExternMemberInfo *memberList = realType->pointerCount ? &NULLC::commonLinker->exTypeExtra[realType->memberOffset + realType->memberCount] : NULL;

			// Check pointer members
			for(unsigned n = 0; n < realType->pointerCount; n++)
			{
				// Get member type
				ExternTypeInfo &subType = NULLC::commonLinker->exTypes[memberList[n].type];
				unsigned pos = memberList[n].offset;

				// Check member
				CheckVariable(ptr + pos, subType);
			}
		}
	}